

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::DoCaptureByteCodeUpwardExposedUsed(BackwardPass *this)

{
  bool bVar1;
  JITTimeFunctionBody *this_00;
  bool local_19;
  BackwardPass *this_local;
  
  if ((this->tag == CaptureByteCodeRegUsePhase) || (local_19 = false, this->tag == DeadStorePhase))
  {
    bVar1 = DoByteCodeUpwardExposedUsed(this);
    local_19 = false;
    if (bVar1) {
      bVar1 = Func::IsJitInDebugMode(this->func);
      local_19 = false;
      if (!bVar1) {
        this_00 = Func::GetJITFunctionBody(this->func);
        bVar1 = JITTimeFunctionBody::IsAsmJsMode(this_00);
        local_19 = false;
        if (!bVar1) {
          local_19 = Func::DoGlobOpt(this->func);
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool BackwardPass::DoCaptureByteCodeUpwardExposedUsed() const
{
#if DBG
    return (this->tag == Js::CaptureByteCodeRegUsePhase || this->tag == Js::DeadStorePhase) &&
        this->DoByteCodeUpwardExposedUsed() &&
        !func->IsJitInDebugMode() &&
        !this->func->GetJITFunctionBody()->IsAsmJsMode() &&
        this->func->DoGlobOpt();
#else
    return false;
#endif
}